

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O0

int tlv_data_get_name(uint8_t *data,size_t buflen,uint8_t **name,size_t *name_len)

{
  uint8_t *puVar1;
  uint8_t *ptr;
  uint32_t real_len;
  uint32_t real_type;
  size_t *name_len_local;
  uint8_t **name_local;
  size_t buflen_local;
  uint8_t *data_local;
  
  _real_len = name_len;
  name_len_local = (size_t *)name;
  name_local = (uint8_t **)buflen;
  buflen_local = (size_t)data;
  puVar1 = tlv_get_type_length(data,buflen,(uint32_t *)((long)&ptr + 4),(uint32_t *)&ptr);
  if (puVar1 == (uint8_t *)0x0) {
    data_local._4_4_ = -0xe;
  }
  else if (ptr._4_4_ == 6) {
    if ((ulong)(uint)ptr == (long)name_local - ((long)puVar1 - buflen_local)) {
      *name_len_local = (size_t)puVar1;
      puVar1 = tlv_get_type_length(puVar1,(long)name_local - ((long)puVar1 - buflen_local),
                                   (uint32_t *)((long)&ptr + 4),(uint32_t *)&ptr);
      if (puVar1 == (uint8_t *)0x0) {
        data_local._4_4_ = -0xe;
      }
      else if (ptr._4_4_ == 7) {
        *_real_len = (ulong)(uint)ptr;
        data_local._4_4_ = 0;
      }
      else {
        data_local._4_4_ = -0x11;
      }
    }
    else {
      data_local._4_4_ = -0xd;
    }
  }
  else {
    data_local._4_4_ = -0xc;
  }
  return data_local._4_4_;
}

Assistant:

int
tlv_data_get_name(uint8_t* data,
                  size_t buflen,
                  uint8_t** name,
                  size_t* name_len)
{
  uint32_t real_type, real_len;
  uint8_t* ptr;

  ptr = tlv_get_type_length(data, buflen, &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != TLV_Data){
    return NDN_WRONG_TLV_TYPE;
  }
  if(real_len != buflen - (ptr - data)){
    return NDN_WRONG_TLV_LENGTH;
  }

  // Name
  *name = ptr;
  ptr = tlv_get_type_length(ptr, buflen - (ptr - data), &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != TLV_Name){
    return NDN_UNSUPPORTED_FORMAT;
  }
  *name_len = real_len;

  return NDN_SUCCESS;
}